

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::ZoneBitVector::_append(ZoneBitVector *this,ZoneAllocator *allocator,bool value)

{
  uint32_t newSize;
  uint uVar1;
  Error EVar2;
  uint idealCapacity;
  
  uVar1 = this->_capacity;
  idealCapacity = 0x80;
  if (0x7f < uVar1) {
    if (uVar1 < 0x8000001) {
      idealCapacity = uVar1 * 2;
    }
    else {
      idealCapacity = uVar1 + 0x8000000;
    }
  }
  newSize = this->_size + 1;
  if ((idealCapacity < uVar1) && (idealCapacity = newSize, this->_size == 0xffffffff)) {
    return 1;
  }
  EVar2 = _resize(this,allocator,newSize,idealCapacity,value);
  return EVar2;
}

Assistant:

Error ZoneBitVector::_append(ZoneAllocator* allocator, bool value) noexcept {
  uint32_t kThreshold = Globals::kGrowThreshold * 8;
  uint32_t newSize = _size + 1;
  uint32_t idealCapacity = _capacity;

  if (idealCapacity < 128)
    idealCapacity = 128;
  else if (idealCapacity <= kThreshold)
    idealCapacity *= 2;
  else
    idealCapacity += kThreshold;

  if (ASMJIT_UNLIKELY(idealCapacity < _capacity)) {
    if (ASMJIT_UNLIKELY(_size == std::numeric_limits<uint32_t>::max()))
      return DebugUtils::errored(kErrorOutOfMemory);
    idealCapacity = newSize;
  }

  return _resize(allocator, newSize, idealCapacity, value);
}